

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::constructAggregate
          (TParseContext *this,TIntermNode *node,TType *type,int paramCount,TSourceLoc *loc)

{
  TIntermediate *this_00;
  byte bVar1;
  TIntermTyped *pTVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *pTVar6;
  char *pcVar7;
  char *pcVar8;
  pool_allocator<char> local_158;
  TString local_150;
  pool_allocator<char> local_128;
  TString local_120;
  TString local_f8;
  pool_allocator<char> local_d0;
  TString local_c8;
  pool_allocator<char> local_a0;
  TString local_98;
  TString local_70;
  byte local_41;
  TIntermTyped *pTStack_40;
  bool enhanced;
  TIntermTyped *converted;
  TSourceLoc *loc_local;
  TType *pTStack_28;
  int paramCount_local;
  TType *type_local;
  TIntermNode *node_local;
  TParseContext *this_local;
  
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  converted = (TIntermTyped *)loc;
  loc_local._4_4_ = paramCount;
  pTStack_28 = type;
  type_local = (TType *)node;
  node_local = (TIntermNode *)this;
  iVar5 = (*node->_vptr_TIntermNode[3])();
  pTStack_40 = TIntermediate::addConversion
                         (this_00,EOpConstructStruct,type,
                          (TIntermTyped *)CONCAT44(extraout_var,iVar5));
  if (pTStack_40 != (TIntermTyped *)0x0) {
    iVar5 = (*(pTStack_40->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar4 = TType::operator!=((TType *)CONCAT44(extraout_var_00,iVar5),pTStack_28);
    if (!bVar4) {
      return pTStack_40;
    }
  }
  local_41 = TIntermediate::getEnhancedMsgs
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  uVar3 = loc_local._4_4_;
  pTVar2 = converted;
  iVar5 = (*type_local->_vptr_TType[3])();
  pTVar6 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0xf0))();
  bVar1 = local_41;
  pool_allocator<char>::pool_allocator(&local_a0);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_98,""
             ,&local_a0);
  pool_allocator<char>::pool_allocator(&local_d0);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_c8,""
             ,&local_d0);
  TType::getCompleteString(&local_70,pTVar6,(bool)(bVar1 & 1),true,true,true,&local_98,&local_c8);
  pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(&local_70);
  pTVar6 = pTStack_28;
  bVar1 = local_41;
  pool_allocator<char>::pool_allocator(&local_128);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_120,
             "",&local_128);
  pool_allocator<char>::pool_allocator(&local_158);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_150,
             "",&local_158);
  TType::getCompleteString(&local_f8,pTVar6,(bool)(bVar1 & 1),true,true,true,&local_120,&local_150);
  pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(&local_f8);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,pTVar2,"","constructor","cannot convert parameter %d from \'%s\' to \'%s\'",
             (ulong)uVar3,pcVar7,pcVar8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_150);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_120);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_c8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_98);
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* TParseContext::constructAggregate(TIntermNode* node, const TType& type, int paramCount, const TSourceLoc& loc)
{
    TIntermTyped* converted = intermediate.addConversion(EOpConstructStruct, type, node->getAsTyped());
    if (! converted || converted->getType() != type) {
        bool enhanced = intermediate.getEnhancedMsgs();
        error(loc, "", "constructor", "cannot convert parameter %d from '%s' to '%s'", paramCount,
              node->getAsTyped()->getType().getCompleteString(enhanced).c_str(), type.getCompleteString(enhanced).c_str());

        return nullptr;
    }

    return converted;
}